

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_bandpre.c
# Opt level: O0

int ARKBandPrecGetNumRhsEvals(void *arkode_mem,long *nfevalsBP)

{
  sunrealtype *in_RSI;
  int retval;
  ARKBandPrecData pdata;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMem *in_stack_ffffffffffffffd0;
  ARKodeMem *in_stack_ffffffffffffffd8;
  ARKodeMem in_stack_ffffffffffffffe0;
  int local_4;
  
  local_4 = arkLs_AccessARKODELMem
                      (in_RSI,(char *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                       in_stack_ffffffffffffffd0);
  if (local_4 == 0) {
    if (in_stack_ffffffffffffffd8[0x1d] == (ARKodeMem)0x0) {
      arkProcessError(in_stack_ffffffffffffffe0,-5,0x10f,"ARKBandPrecGetNumRhsEvals",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bandpre.c"
                      ,"Band preconditioner memory is NULL. ARKBandPrecInit must be called.");
      local_4 = -5;
    }
    else {
      *in_RSI = in_stack_ffffffffffffffd8[0x1d]->SRabstol;
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int ARKBandPrecGetNumRhsEvals(void* arkode_mem, long int* nfevalsBP)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  ARKBandPrecData pdata;
  int retval;

  /* access ARKodeMem and ARKLsMem structures */
  retval = arkLs_AccessARKODELMem(arkode_mem, __func__, &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Return immediately if ARKBandPrecData is NULL */
  if (arkls_mem->P_data == NULL)
  {
    arkProcessError(ark_mem, ARKLS_PMEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_BP_PMEM_NULL);
    return (ARKLS_PMEM_NULL);
  }
  pdata = (ARKBandPrecData)arkls_mem->P_data;

  /* set output */
  *nfevalsBP = pdata->nfeBP;

  return (ARKLS_SUCCESS);
}